

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

ResultBuilder * __thiscall
Catch::ExpressionLhs<unsigned_char_const&>::
captureExpression<(Catch::Internal::Operator)0,unsigned_char>
          (ExpressionLhs<unsigned_char_const&> *this,uchar *rhs)

{
  ResultBuilder *pRVar1;
  OfType OVar2;
  string local_78 [7];
  char value;
  undefined1 local_68 [16];
  undefined1 *local_58;
  undefined1 local_48 [16];
  undefined1 *local_38;
  undefined1 local_28 [16];
  
  value = (char)((ulong)_local_78 >> 0x38);
  OVar2 = ExpressionFailed;
  if (**(uchar **)(this + 8) == *rhs) {
    OVar2 = Ok;
  }
  pRVar1 = *(ResultBuilder **)this;
  (pRVar1->m_data).resultType = OVar2;
  Catch::toString_abi_cxx11_(value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).lhs);
  Catch::toString_abi_cxx11_(value);
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).rhs);
  _local_78 = local_68;
  std::__cxx11::string::_M_construct<char_const*>(local_78,"==","");
  std::__cxx11::string::_M_assign((string *)&(pRVar1->m_exprComponents).op);
  if (_local_78 != local_68) {
    operator_delete(_local_78);
  }
  if (local_58 != local_48) {
    operator_delete(local_58);
  }
  if (local_38 != local_28) {
    operator_delete(local_38);
  }
  return pRVar1;
}

Assistant:

ResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_rb
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }